

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O3

void Kf_ManSetInitRefs(Gia_Man_t *p,Vec_Flt_t *vRefs)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  float *pfVar5;
  ulong uVar6;
  Gia_Obj_t *pGVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  Gia_Obj_t *pGVar12;
  Gia_Obj_t *pData1;
  Gia_Obj_t *pData0;
  Gia_Obj_t *local_40;
  Gia_Obj_t *local_38;
  
  uVar4 = p->nObjs;
  if (vRefs->nCap < (int)uVar4) {
    if (vRefs->pArray == (float *)0x0) {
      pfVar5 = (float *)malloc((long)(int)uVar4 << 2);
    }
    else {
      pfVar5 = (float *)realloc(vRefs->pArray,(long)(int)uVar4 << 2);
    }
    vRefs->pArray = pfVar5;
    vRefs->nCap = uVar4;
  }
  if (0 < (int)uVar4) {
    memset(vRefs->pArray,0,(ulong)uVar4 * 4);
  }
  vRefs->nSize = uVar4;
  uVar6 = (ulong)(uint)p->nObjs;
  if (0 < p->nObjs) {
    lVar10 = 0;
    lVar11 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar12 = (Gia_Obj_t *)(&p->pObjs->field_0x0 + lVar10);
      uVar4 = (uint)*(undefined8 *)pGVar12;
      if ((~uVar4 & 0x1fffffff) != 0 && -1 < (int)uVar4) {
        uVar6 = (ulong)-(uVar4 & 0x1fffffff) + lVar11;
        iVar3 = (int)uVar6;
        if ((iVar3 < 0) || (uVar4 = vRefs->nSize, (int)uVar4 <= iVar3)) goto LAB_0076328e;
        pfVar5 = vRefs->pArray;
        uVar6 = uVar6 & 0xffffffff;
        pfVar5[uVar6] = pfVar5[uVar6] + 1.0;
        uVar6 = (ulong)-(*(uint *)&pGVar12->field_0x4 & 0x1fffffff) + lVar11;
        uVar2 = (uint)uVar6;
        if (((int)uVar2 < 0) || (uVar4 <= uVar2)) goto LAB_0076328e;
        uVar6 = uVar6 & 0xffffffff;
        pfVar5[uVar6] = pfVar5[uVar6] + 1.0;
        iVar3 = Gia_ObjIsMuxType(pGVar12);
        if (iVar3 == 0) {
          uVar6 = (ulong)(uint)p->nObjs;
        }
        else {
          pGVar7 = Gia_ObjRecognizeMux(pGVar12,&local_40,&local_38);
          pGVar7 = (Gia_Obj_t *)((ulong)pGVar7 & 0xfffffffffffffffe);
          pGVar12 = p->pObjs;
          if (pGVar7 < pGVar12) {
LAB_007632eb:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          uVar6 = (ulong)p->nObjs;
          if (pGVar12 + uVar6 <= pGVar7) goto LAB_007632eb;
          uVar4 = (int)((long)pGVar7 - (long)pGVar12 >> 2) * -0x55555555;
          if (((int)uVar4 < 0) || (uVar2 = vRefs->nSize, (int)uVar2 <= (int)uVar4))
          goto LAB_0076328e;
          pfVar5 = vRefs->pArray;
          pfVar5[uVar4 & 0x7fffffff] = pfVar5[uVar4 & 0x7fffffff] + -1.0;
          pGVar7 = (Gia_Obj_t *)((ulong)local_38 & 0xfffffffffffffffe);
          if (pGVar7 == (Gia_Obj_t *)((ulong)local_40 & 0xfffffffffffffffe)) {
            if ((pGVar7 < pGVar12) || (pGVar12 + uVar6 <= pGVar7)) goto LAB_007632eb;
            uVar4 = (int)((long)pGVar7 - (long)pGVar12 >> 2) * -0x55555555;
            if (((int)uVar4 < 0) || (uVar2 <= uVar4)) goto LAB_0076328e;
            pfVar5[uVar4 & 0x7fffffff] = pfVar5[uVar4 & 0x7fffffff] + -1.0;
          }
        }
      }
      lVar11 = lVar11 + 1;
      lVar10 = lVar10 + 0xc;
    } while (lVar11 < (int)uVar6);
  }
  lVar10 = (long)p->vCos->nSize;
  if (0 < lVar10) {
    piVar1 = p->vCos->pArray;
    lVar11 = 0;
    do {
      iVar3 = piVar1[lVar11];
      if (((long)iVar3 < 0) || ((int)uVar6 <= iVar3)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar4 = iVar3 - (*(uint *)(p->pObjs + iVar3) & 0x1fffffff);
      if (((int)uVar4 < 0) || (vRefs->nSize <= (int)uVar4)) {
LAB_0076328e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                      ,0x195,"void Vec_FltAddToEntry(Vec_Flt_t *, int, float)");
      }
      vRefs->pArray[uVar4] = vRefs->pArray[uVar4] + 1.0;
      lVar11 = lVar11 + 1;
    } while (lVar10 != lVar11);
  }
  if (0 < (int)uVar6) {
    uVar9 = 0;
    uVar8 = (ulong)(uint)vRefs->nSize;
    if (vRefs->nSize < 1) {
      uVar8 = uVar9;
    }
    do {
      if (uVar8 == uVar9) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                      ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
      }
      pfVar5 = vRefs->pArray + uVar9;
      if (*pfVar5 <= 1.0 && *pfVar5 != 1.0) {
        vRefs->pArray[uVar9] = 1.0;
      }
      uVar9 = uVar9 + 1;
    } while ((uVar6 & 0xffffffff) != uVar9);
  }
  return;
}

Assistant:

void Kf_ManSetInitRefs( Gia_Man_t * p, Vec_Flt_t * vRefs )
{
    Gia_Obj_t * pObj, * pCtrl, * pData0, * pData1; int i;
    Vec_FltFill( vRefs, Gia_ManObjNum(p), 0 );
    Gia_ManForEachAnd( p, pObj, i )
    {
        Vec_FltAddToEntry( vRefs, Gia_ObjFaninId0(pObj, i), 1 );
        Vec_FltAddToEntry( vRefs, Gia_ObjFaninId1(pObj, i), 1 );
        if ( !Gia_ObjIsMuxType(pObj) )
            continue;
        // discount XOR/MUX
        pCtrl = Gia_ObjRecognizeMux( pObj, &pData1, &pData0 );
        Vec_FltAddToEntry( vRefs, Gia_ObjId(p, Gia_Regular(pCtrl)), -1 );
        if ( Gia_Regular(pData0) == Gia_Regular(pData1) )
            Vec_FltAddToEntry( vRefs, Gia_ObjId(p, Gia_Regular(pData0)), -1 );
    }
    Gia_ManForEachCo( p, pObj, i )
        Vec_FltAddToEntry( vRefs, Gia_ObjFaninId0(pObj, Gia_ObjId(p, pObj)), 1 );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        Vec_FltUpdateEntry( vRefs, i, 1 );
}